

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::anon_unknown_0::AdvancedResourcesMax::RunIteration(AdvancedResourcesMax *this,GLuint index)

{
  CallLogWrapper *this_00;
  long lVar1;
  GLuint *pGVar2;
  GLuint GVar3;
  GLint GVar4;
  undefined8 in_RAX;
  GLuint *value;
  value_type_conflict4 *__val;
  long lVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 uStack_38;
  GLuint data;
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  lVar5 = 0;
  _uStack_38 = in_RAX;
  do {
    lVar1 = lVar5 + 1;
    _uStack_38 = CONCAT44((int)lVar1,uStack_38);
    glu::CallLogWrapper::glBindBufferBase
              (this_00,0x90d2,(GLuint)lVar5,this->m_storage_buffer[lVar5]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,4,&data,0x88e4);
    lVar5 = lVar1;
  } while (lVar1 != 8);
  lVar5 = 0;
  do {
    lVar1 = lVar5 + 1;
    _uStack_38 = CONCAT44((int)lVar1,uStack_38);
    glu::CallLogWrapper::glBindBufferBase
              (this_00,0x8a11,(GLuint)lVar5,this->m_uniform_buffer[lVar5]);
    glu::CallLogWrapper::glBufferData(this_00,0x8a11,4,&data,0x88e4);
    lVar5 = lVar1;
  } while (lVar1 != 0xc);
  lVar5 = 0;
  do {
    lVar1 = lVar5 + 1;
    _uStack_38 = CONCAT44((int)lVar1,uStack_38);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,(GLuint)lVar5,this->m_atomic_buffer[lVar5])
    ;
    glu::CallLogWrapper::glBufferData(this_00,0x92c0,4,&data,0x88e4);
    lVar5 = lVar1;
  } while (lVar1 != 8);
  lVar5 = 0;
  do {
    lVar1 = lVar5 + 1;
    _uStack_38 = CONCAT44((int)lVar1,uStack_38);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_texture_buffer[lVar5]);
    glu::CallLogWrapper::glBufferData(this_00,0x8c2a,4,&data,0x88e9);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
    glu::CallLogWrapper::glActiveTexture(this_00,(uint)lVar5 | 0x84c0);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_texture[lVar5]);
    glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8236,this->m_texture_buffer[lVar5]);
    lVar5 = lVar1;
  } while (lVar1 != 0x10);
  lVar5 = 0;
  do {
    lVar1 = lVar5 + 1;
    _uStack_38 = CONCAT44((int)lVar1,uStack_38);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_image_buffer[lVar5]);
    glu::CallLogWrapper::glBufferData(this_00,0x8c2a,4,&data,0x88ea);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_image[lVar5]);
    glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8236,this->m_image_buffer[lVar5]);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,0);
    glu::CallLogWrapper::glBindImageTexture
              (this_00,(GLuint)lVar5,this->m_image[lVar5],0,'\0',0,35000,0x8236);
    lVar5 = lVar1;
  } while (lVar1 != 8);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_index");
  glu::CallLogWrapper::glUniform1ui(this_00,GVar4,index);
  value = (GLuint *)operator_new(0x780);
  lVar5 = 0;
  memset(value,0,0x780);
  iVar7 = 2;
  iVar8 = 3;
  iVar9 = 0;
  iVar10 = 1;
  do {
    pGVar2 = value + lVar5;
    *pGVar2 = iVar9 + 1;
    pGVar2[1] = iVar10 + 1;
    pGVar2[2] = iVar7 + 1;
    pGVar2[3] = iVar8 + 1;
    lVar5 = lVar5 + 4;
    iVar9 = iVar9 + 4;
    iVar10 = iVar10 + 4;
    iVar7 = iVar7 + 4;
    iVar8 = iVar8 + 4;
  } while (lVar5 != 0x1e0);
  GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_uniform_def");
  glu::CallLogWrapper::glUniform1uiv(this_00,GVar4,0x1e0,value);
  operator_delete(value,0x780);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[index]);
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,4,&data);
  GVar3 = data;
  uVar6 = index * 6 + 6;
  if (data != uVar6) {
    anon_unknown_0::Output("Data is %d should be %d.\n",(ulong)data,(ulong)uVar6);
  }
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  return GVar3 == uVar6;
}

Assistant:

bool RunIteration(GLuint index)
	{
		for (GLuint i = 0; i < 8; ++i)
		{
			const GLuint data = i + 1;
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data, GL_STATIC_DRAW);
		}
		for (GLuint i = 0; i < 12; ++i)
		{
			const GLuint data = i + 1;
			glBindBufferBase(GL_UNIFORM_BUFFER, i, m_uniform_buffer[i]);
			glBufferData(GL_UNIFORM_BUFFER, sizeof(data), &data, GL_STATIC_DRAW);
		}
		for (GLuint i = 0; i < 8; ++i)
		{
			const GLuint data = i + 1;
			glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, i, m_atomic_buffer[i]);
			glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(data), &data, GL_STATIC_DRAW);
		}
		for (GLuint i = 0; i < 16; ++i)
		{
			const GLuint data = i + 1;
			glBindBuffer(GL_TEXTURE_BUFFER, m_texture_buffer[i]);
			glBufferData(GL_TEXTURE_BUFFER, sizeof(data), &data, GL_DYNAMIC_READ);
			glBindBuffer(GL_TEXTURE_BUFFER, 0);

			glActiveTexture(GL_TEXTURE0 + i);
			glBindTexture(GL_TEXTURE_BUFFER, m_texture[i]);
			glTexBuffer(GL_TEXTURE_BUFFER, GL_R32UI, m_texture_buffer[i]);
		}
		for (GLuint i = 0; i < 8; ++i)
		{
			const GLuint data = i + 1;
			glBindBuffer(GL_TEXTURE_BUFFER, m_image_buffer[i]);
			glBufferData(GL_TEXTURE_BUFFER, sizeof(data), &data, GL_DYNAMIC_COPY);
			glBindBuffer(GL_TEXTURE_BUFFER, 0);

			glBindTexture(GL_TEXTURE_BUFFER, m_image[i]);
			glTexBuffer(GL_TEXTURE_BUFFER, GL_R32UI, m_image_buffer[i]);
			glBindTexture(GL_TEXTURE_BUFFER, 0);

			glBindImageTexture(i, m_image[i], 0, GL_FALSE, 0, GL_READ_ONLY, GL_R32UI);
		}

		glUseProgram(m_program);
		glUniform1ui(glGetUniformLocation(m_program, "g_index"), index);
		/* uniform array */
		{
			std::vector<GLuint> data(480);
			for (GLuint i = 0; i < static_cast<GLuint>(data.size()); ++i)
				data[i]   = i + 1;
			glUniform1uiv(glGetUniformLocation(m_program, "g_uniform_def"), static_cast<GLsizei>(data.size()),
						  &data[0]);
		}
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		bool result = true;
		/* validate buffer */
		{
			GLuint data;
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[index]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), &data);

			if (data != (index + 1) * 6)
			{
				Output("Data is %d should be %d.\n", data, (index + 1) * 6);
				result = false;
			}
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		}
		return result;
	}